

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

void __thiscall cmCPackIFWRepository::cmCPackIFWRepository(cmCPackIFWRepository *this)

{
  cmCPackIFWRepository *this_local;
  
  cmCPackIFWCommon::cmCPackIFWCommon(&this->super_cmCPackIFWCommon);
  std::__cxx11::string::string((string *)&this->Name);
  this->Update = None;
  std::__cxx11::string::string((string *)&this->Url);
  std::__cxx11::string::string((string *)&this->OldUrl);
  std::__cxx11::string::string((string *)&this->NewUrl);
  std::__cxx11::string::string((string *)&this->Enabled);
  std::__cxx11::string::string((string *)&this->Username);
  std::__cxx11::string::string((string *)&this->Password);
  std::__cxx11::string::string((string *)&this->DisplayName);
  std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::vector
            (&this->RepositoryUpdate);
  std::__cxx11::string::string((string *)&this->Directory);
  return;
}

Assistant:

cmCPackIFWRepository::cmCPackIFWRepository()
  : Update(cmCPackIFWRepository::None)
{
}